

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O3

void __thiscall iutest::detail::IParamTestSuiteInfo::~IParamTestSuiteInfo(IParamTestSuiteInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppIVar3;
  
  this->_vptr_IParamTestSuiteInfo = (_func_int **)&PTR__IParamTestSuiteInfo_00136d50;
  pcVar2 = (this->m_package_name)._M_dataplus._M_p;
  paVar1 = &(this->m_package_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_testsuite_base_name)._M_dataplus._M_p;
  paVar1 = &(this->m_testsuite_base_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ppIVar3 = (this->m_testinfos).
            super__Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar3 != (pointer)0x0) {
    operator_delete(ppIVar3,(long)(this->m_testinfos).
                                  super__Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar3
                   );
    return;
  }
  return;
}

Assistant:

virtual ~IParamTestSuiteInfo() {}